

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

void __thiscall
QAbstractItemView::initViewItemOption(QAbstractItemView *this,QStyleOptionViewItem *option)

{
  bool bVar1;
  int iVar2;
  QAbstractItemViewPrivate *this_00;
  QFont *pQVar3;
  QStyle *pQVar4;
  QFlags<QLocale::NumberOption> *this_01;
  long in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  int pm;
  QAbstractItemViewPrivate *d;
  QWidget *in_stack_ffffffffffffff88;
  ViewItemFeature flags;
  QLocale *other;
  QRect *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  QLocale local_38;
  undefined4 local_2c;
  undefined8 local_28;
  undefined8 local_20;
  QFlagsStorage<Qt::AlignmentFlag> local_18;
  undefined4 local_14;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QAbstractItemView *)0x81015f);
  QStyleOption::initFrom
            ((QStyleOption *)this_00,
             (QWidget *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  QFlags<QStyle::StateFlag>::operator&=((QFlags<QStyle::StateFlag> *)(in_RSI + 8),-0x2001);
  pQVar3 = QWidget::font(in_RDI);
  QFont::operator=((QFont *)(in_RSI + 0x58),pQVar3);
  bVar1 = QWidget::hasFocus((QWidget *)this_00);
  if (!bVar1) {
    QFlags<QStyle::StateFlag>::operator&=((QFlags<QStyle::StateFlag> *)(in_RSI + 8),-0x10001);
  }
  QFlags<QStyle::StateFlag>::operator&=((QFlags<QStyle::StateFlag> *)(in_RSI + 8),-0x101);
  bVar1 = QSize::isValid((QSize *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  if (bVar1) {
    *(QSize *)(in_RSI + 0x50) = this_00->iconSize;
  }
  else {
    pQVar4 = QWidget::style(in_stack_ffffffffffffff88);
    (**(code **)(*(long *)pQVar4 + 0xe0))(pQVar4,0x3e,0,in_RDI);
    QSize::QSize((QSize *)in_stack_ffffffffffffff90,(int)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                 (int)in_stack_ffffffffffffff88);
    *(undefined8 *)(in_RSI + 0x50) = local_10;
  }
  *(undefined4 *)(in_RSI + 0x4c) = 0;
  QFlags<Qt::AlignmentFlag>::QFlags
            ((QFlags<Qt::AlignmentFlag> *)in_stack_ffffffffffffff90,
             (AlignmentFlag)((ulong)in_stack_ffffffffffffff88 >> 0x20));
  *(undefined4 *)(in_RSI + 0x44) = local_14;
  local_18.i = (Int)Qt::operator|((enum_type)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                                  (enum_type)in_stack_ffffffffffffff90);
  ((QFlagsStorageHelper<Qt::AlignmentFlag,_4> *)(in_RSI + 0x40))->
  super_QFlagsStorage<Qt::AlignmentFlag> = (QFlagsStorage<Qt::AlignmentFlag>)local_18.i;
  *(TextElideMode *)(in_RSI + 0x48) = this_00->textElideMode;
  QRect::QRect(in_stack_ffffffffffffff90);
  *(undefined8 *)(in_RSI + 0x10) = local_28;
  *(undefined8 *)(in_RSI + 0x18) = local_20;
  pQVar4 = QWidget::style(in_stack_ffffffffffffff88);
  flags = (ViewItemFeature)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  iVar2 = (**(code **)(*(long *)pQVar4 + 0xf0))(pQVar4,0x3c,0,in_RDI);
  *(bool *)(in_RSI + 0x68) = iVar2 != 0;
  if ((this_00->wrapItemText & 1U) != 0) {
    QFlags<QStyleOptionViewItem::ViewItemFeature>::QFlags
              ((QFlags<QStyleOptionViewItem::ViewItemFeature> *)in_stack_ffffffffffffff90,flags);
    *(undefined4 *)(in_RSI + 0x6c) = local_2c;
  }
  other = &local_38;
  QWidget::locale(in_RDI);
  QLocale::operator=((QLocale *)in_stack_ffffffffffffff90,other);
  QLocale::~QLocale(other);
  this_01 = (QFlags<QLocale::NumberOption> *)(in_RSI + 0x70);
  QFlags<QLocale::NumberOption>::QFlags(this_01,(NumberOption)((ulong)other >> 0x20));
  QLocale::setNumberOptions((QFlags_conflict1 *)this_01);
  *(QWidget **)(in_RSI + 0x78) = in_RDI;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemView::initViewItemOption(QStyleOptionViewItem *option) const
{
    Q_D(const QAbstractItemView);
    option->initFrom(this);
    option->state &= ~QStyle::State_MouseOver;
    option->font = font();

    // On mac the focus appearance follows window activation
    // not widget activation
    if (!hasFocus())
        option->state &= ~QStyle::State_Active;

    option->state &= ~QStyle::State_HasFocus;
    if (d->iconSize.isValid()) {
        option->decorationSize = d->iconSize;
    } else {
        int pm = style()->pixelMetric(QStyle::PM_SmallIconSize, nullptr, this);
        option->decorationSize = QSize(pm, pm);
    }
    option->decorationPosition = QStyleOptionViewItem::Left;
    option->decorationAlignment = Qt::AlignCenter;
    option->displayAlignment = Qt::AlignLeft|Qt::AlignVCenter;
    option->textElideMode = d->textElideMode;
    option->rect = QRect();
    option->showDecorationSelected = style()->styleHint(QStyle::SH_ItemView_ShowDecorationSelected, nullptr, this);
    if (d->wrapItemText)
        option->features = QStyleOptionViewItem::WrapText;
    option->locale = locale();
    option->locale.setNumberOptions(QLocale::OmitGroupSeparator);
    option->widget = this;
}